

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi-seq2.c
# Opt level: O1

uint64_t pi_mc(long start,long cnt)

{
  int iVar1;
  uint64_t uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  lVar5 = 0;
  for (; cnt != 1; cnt = (cnt - (cnt + 1 >> 0x3f)) + 1 >> 1) {
    uVar2 = pi_mc(start,cnt / 2);
    start = start + cnt / 2;
    lVar5 = lVar5 + uVar2;
  }
  iVar3 = seed * 0x41c64e6d;
  uVar4 = (iVar3 + 0x3039U) / 0x7fffffff;
  iVar1 = seed * -0x3d5d6597;
  seed = iVar1 + 0xd3dc167e;
  dVar6 = (double)(int)(iVar3 + (uVar4 << 0x1f | uVar4) + 0x3039) / 2147483647.0;
  dVar7 = (double)(int)(iVar1 + (seed / 0x7fffffff << 0x1f | seed / 0x7fffffff) + -0x2c23e982) /
          2147483647.0;
  dVar6 = dVar6 * dVar6 + dVar7 * dVar7;
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  return lVar5 + (ulong)(dVar6 < 1.0);
}

Assistant:

uint64_t pi_mc(long start, long cnt)
{
    if (cnt == 1) {
        double x = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        double y = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        return sqrt(x*x+y*y) < 1.0 ? 1 : 0;
    }
    return pi_mc(start, cnt/2) + pi_mc(start+cnt/2, (cnt+1)/2);
}